

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# legacy.c
# Opt level: O3

xmlChar * xmlNamespaceParseQName(xmlParserCtxtPtr ctxt,xmlChar **prefix)

{
  xmlGenericErrorFunc p_Var1;
  xmlGenericErrorFunc *pp_Var2;
  void **ppvVar3;
  
  if (xmlNamespaceParseQName_deprecated == '\0') {
    pp_Var2 = __xmlGenericError();
    p_Var1 = *pp_Var2;
    ppvVar3 = __xmlGenericErrorContext();
    (*p_Var1)(*ppvVar3,"xmlNamespaceParseQName() deprecated function reached\n");
    xmlNamespaceParseQName_deprecated = '\x01';
  }
  return (xmlChar *)0x0;
}

Assistant:

xmlChar *
xmlNamespaceParseQName(xmlParserCtxtPtr ctxt ATTRIBUTE_UNUSED,
                       xmlChar ** prefix ATTRIBUTE_UNUSED)
{

    static int deprecated = 0;

    if (!deprecated) {
        xmlGenericError(xmlGenericErrorContext,
                        "xmlNamespaceParseQName() deprecated function reached\n");
        deprecated = 1;
    }
    return (NULL);
}